

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

int __thiscall UdpLayer::okay(UdpLayer *this)

{
  bool local_12;
  bool nonFatalError;
  UdpLayer *this_local;
  
  bdMutex::lock(&this->sockMtx);
  local_12 = true;
  if ((this->errorState != 0) && (local_12 = true, this->errorState != 0xb)) {
    local_12 = this->errorState == 0x73;
  }
  bdMutex::unlock(&this->sockMtx);
  return (int)local_12;
}

Assistant:

int UdpLayer::okay() {
	sockMtx.lock();   /********** LOCK MUTEX *********/

	bool nonFatalError = ((errorState == 0) ||
				(errorState == EAGAIN) ||
				(errorState == EINPROGRESS));

	sockMtx.unlock(); /******** UNLOCK MUTEX *********/

#ifdef DEBUG_UDP_LAYER
	if (!nonFatalError) {
		std::cerr << "UdpLayer::NOT okay(): Error: " << errorState << std::endl;
	}

#endif

	return nonFatalError;
}